

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O1

c_v256 * c_v256_unpacklo_u16_s32(c_v256 a)

{
  c_v256 *in_RDI;
  
  in_RDI->u64[2] = (ulong)(a.u32[2] & 0xffff0000) << 0x10 | a.u64[1] & 0xffff;
  in_RDI->u64[3] = a.u64[1] >> 0x10 & 0xffff00000000 | a.u64[1] >> 0x20 & 0xffff;
  in_RDI->u64[0] = (ulong)(a.u32[0] & 0xffff0000) << 0x10 | a.u64[0] & 0xffff;
  in_RDI->u64[1] = a.u64[0] >> 0x10 & 0xffff00000000 | a.u64[0] >> 0x20 & 0xffff;
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_unpacklo_u16_s32(c_v256 a) {
  return c_v256_from_v128(c_v128_unpackhi_u16_s32(a.v128[0]),
                          c_v128_unpacklo_u16_s32(a.v128[0]));
}